

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O1

void __thiscall
GenericModel::multiData(GenericModel *this,QModelIndex *index,QModelRoleDataSpan roleDataSpan)

{
  GenericModelItem **ppGVar1;
  QModelRoleData *pQVar2;
  int iVar3;
  GenericModelPrivate *pGVar4;
  GenericModelItem *pGVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  GenericModelItem **ppGVar10;
  QModelRoleData *pQVar11;
  int role;
  int local_bc;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 uStack_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 uStack_60;
  PrivateShared *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pQVar11 = roleDataSpan.m_modelRoleData;
  if (roleDataSpan.m_len != 0) {
    pQVar2 = pQVar11 + roleDataSpan.m_len * 0x28;
    pGVar4 = this->m_dptr;
    ppGVar1 = &pGVar4->root;
    ppGVar10 = (GenericModelItem **)&index->i;
    if (index->m == (QAbstractItemModel *)0x0) {
      ppGVar10 = ppGVar1;
    }
    if ((index->c | index->r) < 0) {
      ppGVar10 = ppGVar1;
    }
    pGVar5 = *ppGVar10;
    do {
      iVar3 = *(int *)pQVar11;
      local_bc = iVar3;
      if (pGVar4->m_mergeDisplayEdit != false) {
        local_bc = 0;
      }
      if (iVar3 != 2) {
        local_bc = iVar3;
      }
      local_98.shared = (PrivateShared *)0x0;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      local_80 = 2;
      QMap<int,_QVariant>::value
                ((QVariant *)&local_b8,&pGVar5->data,&local_bc,(QVariant *)&local_98);
      uVar9 = uStack_a0;
      uVar8 = local_b8._16_8_;
      uVar7 = local_b8._8_8_;
      uVar6 = local_b8.shared;
      local_b8.shared = (PrivateShared *)0x0;
      local_b8._8_8_ = 0;
      local_b8._16_8_ = 0;
      uStack_a0 = 2;
      local_78.shared = (PrivateShared *)*(undefined8 *)(pQVar11 + 8);
      local_78._8_8_ = *(undefined8 *)(pQVar11 + 0x10);
      local_78._16_8_ = *(undefined8 *)(pQVar11 + 0x18);
      uStack_60 = *(undefined8 *)(pQVar11 + 0x20);
      *(undefined8 *)(pQVar11 + 0x18) = uVar8;
      *(undefined8 *)(pQVar11 + 0x20) = uVar9;
      *(undefined8 *)(pQVar11 + 8) = uVar6;
      *(undefined8 *)(pQVar11 + 0x10) = uVar7;
      local_58 = local_78.shared;
      uStack_50 = local_78._8_8_;
      local_48 = local_78._16_8_;
      uStack_40 = uStack_60;
      ::QVariant::~QVariant((QVariant *)&local_78);
      ::QVariant::~QVariant((QVariant *)&local_b8);
      ::QVariant::~QVariant((QVariant *)&local_98);
      pQVar11 = pQVar11 + 0x28;
    } while (pQVar11 != pQVar2);
  }
  return;
}

Assistant:

void GenericModel::multiData(const QModelIndex &index, QModelRoleDataSpan roleDataSpan) const
{
    Q_ASSERT(index.isValid() && index.model() == this);
    Q_D(const GenericModel);
    const GenericModelItem *const item = d->itemForIndex(index);
    for (QModelRoleData &roleData : roleDataSpan) {
        int role = roleData.role();
        if (d->m_mergeDisplayEdit && role == Qt::EditRole)
            role = Qt::DisplayRole;
        roleData.setData(item->data.value(role));
    }
}